

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMaybe.hpp
# Opt level: O1

bool deqp::gles31::Functional::anon_unknown_0::requiresAdvancedBlendEq
               (BlendState *pre,BlendState *post,
               vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
               *drawBuffers)

{
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *pEVar1;
  pointer pDVar2;
  byte bVar3;
  uint uVar4;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  *pMVar5;
  ulong uVar6;
  byte bVar7;
  
  pEVar1 = (pre->blendEq).m_ptr;
  if (((pEVar1 == (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                   *)0x0) || (pEVar1->m_isFirst != true)) ||
     (uVar4 = *(pEVar1->field_1).m_first - 0x9294, 0x1c < uVar4)) {
    bVar3 = 0;
  }
  else {
    bVar3 = (&DAT_01cd5078)[uVar4];
  }
  pEVar1 = (post->blendEq).m_ptr;
  if ((pEVar1 != (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                  *)0x0) && (pEVar1->m_isFirst == true)) {
    uVar4 = *(pEVar1->field_1).m_first - 0x9294;
    if (uVar4 < 0x1d) {
      bVar7 = (&DAT_01cd5078)[uVar4];
    }
    else {
      bVar7 = 0;
    }
    bVar3 = bVar3 | bVar7;
  }
  pDVar2 = (drawBuffers->
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (uint)((ulong)((long)(drawBuffers->
                               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2) >> 7);
  if (0 < (int)uVar4) {
    uVar6 = (ulong)(uVar4 & 0x7fffffff);
    pMVar5 = &(pDVar2->m_blendState).blendEq;
    do {
      pEVar1 = pMVar5->m_ptr;
      if ((pEVar1 != (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                      *)0x0) && (pEVar1->m_isFirst == true)) {
        uVar4 = *(pEVar1->field_1).m_first - 0x9294;
        if (uVar4 < 0x1d) {
          bVar7 = (&DAT_01cd5078)[uVar4];
        }
        else {
          bVar7 = 0;
        }
        bVar3 = bVar3 | bVar7;
      }
      pMVar5 = pMVar5 + 4;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return (bool)(bVar3 & 1);
}

Assistant:

operator bool	(void) const { return !!m_ptr; }